

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_ReleaseMessage_Test::TestBody(ArenaTest_ReleaseMessage_Test *this)

{
  bool bVar1;
  TestAllTypes *this_00;
  TestAllTypes_NestedMessage *pTVar2;
  pointer this_01;
  char *pcVar3;
  AssertHelper local_128;
  Message local_120;
  undefined1 local_118 [8];
  AssertionResult gtest_ar_1;
  NestedMessage *released_null;
  Message local_f8;
  int32_t local_f0;
  int local_ec;
  undefined1 local_e8 [8];
  AssertionResult gtest_ar;
  unique_ptr<proto2_unittest::TestAllTypes_NestedMessage,_std::default_delete<proto2_unittest::TestAllTypes_NestedMessage>_>
  nested;
  TestAllTypes *arena_message;
  Arena arena;
  ArenaTest_ReleaseMessage_Test *this_local;
  
  arena.impl_.first_arena_.cached_blocks_ = (CachedBlock **)this;
  Arena::Arena((Arena *)&arena_message);
  this_00 = Arena::Create<proto2_unittest::TestAllTypes>((Arena *)&arena_message);
  pTVar2 = proto2_unittest::TestAllTypes::mutable_optional_nested_message(this_00);
  proto2_unittest::TestAllTypes_NestedMessage::set_bb(pTVar2,0x76);
  pTVar2 = proto2_unittest::TestAllTypes::release_optional_nested_message(this_00);
  std::
  unique_ptr<proto2_unittest::TestAllTypes_NestedMessage,std::default_delete<proto2_unittest::TestAllTypes_NestedMessage>>
  ::unique_ptr<std::default_delete<proto2_unittest::TestAllTypes_NestedMessage>,void>
            ((unique_ptr<proto2_unittest::TestAllTypes_NestedMessage,std::default_delete<proto2_unittest::TestAllTypes_NestedMessage>>
              *)&gtest_ar.message_,pTVar2);
  local_ec = 0x76;
  this_01 = std::
            unique_ptr<proto2_unittest::TestAllTypes_NestedMessage,_std::default_delete<proto2_unittest::TestAllTypes_NestedMessage>_>
            ::operator->((unique_ptr<proto2_unittest::TestAllTypes_NestedMessage,_std::default_delete<proto2_unittest::TestAllTypes_NestedMessage>_>
                          *)&gtest_ar.message_);
  local_f0 = proto2_unittest::TestAllTypes_NestedMessage::bb(this_01);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_e8,"118","nested->bb()",&local_ec,&local_f0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_e8);
  if (!bVar1) {
    testing::Message::Message(&local_f8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_e8);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&released_null,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x309,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&released_null,&local_f8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&released_null);
    testing::Message::~Message(&local_f8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_e8);
  gtest_ar_1.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )proto2_unittest::TestAllTypes::release_optional_nested_message(this_00);
  testing::internal::EqHelper::Compare<proto2_unittest::TestAllTypes_NestedMessage>
            ((EqHelper *)local_118,"nullptr","released_null",(nullptr_t)0x0,
             (TestAllTypes_NestedMessage *)
             gtest_ar_1.message_._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_118);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_118);
    testing::internal::AssertHelper::AssertHelper
              (&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x30d,pcVar3);
    testing::internal::AssertHelper::operator=(&local_128,&local_120);
    testing::internal::AssertHelper::~AssertHelper(&local_128);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_118);
  std::
  unique_ptr<proto2_unittest::TestAllTypes_NestedMessage,_std::default_delete<proto2_unittest::TestAllTypes_NestedMessage>_>
  ::~unique_ptr((unique_ptr<proto2_unittest::TestAllTypes_NestedMessage,_std::default_delete<proto2_unittest::TestAllTypes_NestedMessage>_>
                 *)&gtest_ar.message_);
  Arena::~Arena((Arena *)&arena_message);
  return;
}

Assistant:

TEST(ArenaTest, ReleaseMessage) {
  Arena arena;
  TestAllTypes* arena_message = Arena::Create<TestAllTypes>(&arena);
  arena_message->mutable_optional_nested_message()->set_bb(118);
  std::unique_ptr<TestAllTypes::NestedMessage> nested(
      arena_message->release_optional_nested_message());
  EXPECT_EQ(118, nested->bb());

  TestAllTypes::NestedMessage* released_null =
      arena_message->release_optional_nested_message();
  EXPECT_EQ(nullptr, released_null);
}